

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void * cmGetSource(void *arg,char *name)

{
  string *filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this;
  undefined8 *puVar2;
  _Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_> _Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_bool>
  pVar5;
  value_type entry;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  this = cmMakefile::GetSource((cmMakefile *)arg,&local_58,Ambiguous);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (this == (cmSourceFile *)0x0) {
    return (void *)0x0;
  }
  if (cmCPluginAPISourceFiles.
      super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    _Var3._M_node =
         &cmCPluginAPISourceFiles.
          super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = cmCPluginAPISourceFiles.
             super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(cmSourceFile **)(p_Var4 + 1) >= this) {
        _Var3._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(cmSourceFile **)(p_Var4 + 1) < this];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var3._M_node !=
         &cmCPluginAPISourceFiles.
          super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
          ._M_t._M_impl.super__Rb_tree_header) && (*(cmSourceFile **)(_Var3._M_node + 1) <= this))
    goto LAB_001f55c5;
  }
  puVar2 = (undefined8 *)operator_new(0xb8);
  puVar2[1] = puVar2 + 3;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 0;
  local_38 = (string *)(puVar2 + 5);
  puVar2[5] = puVar2 + 7;
  puVar2[6] = 0;
  *(undefined1 *)(puVar2 + 7) = 0;
  filename = (string *)(puVar2 + 9);
  puVar2[9] = puVar2 + 0xb;
  puVar2[10] = 0;
  *(undefined1 *)(puVar2 + 0xb) = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = 0;
  puVar2[0x10] = puVar2 + 0x16;
  puVar2[0x11] = 1;
  puVar2[0x12] = 0;
  puVar2[0x13] = 0;
  *(undefined4 *)(puVar2 + 0x14) = 0x3f800000;
  puVar2[0x15] = 0;
  puVar2[0x16] = 0;
  *puVar2 = this;
  cmSourceFile::GetFullPath(this,(string *)0x0);
  std::__cxx11::string::_M_assign((string *)filename);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_58,filename);
  std::__cxx11::string::operator=((string *)(puVar2 + 1),(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_58,filename);
  std::__cxx11::string::operator=(local_38,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)this;
  local_58._M_string_length = (size_type)puVar2;
  pVar5 = std::
          _Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>,std::_Select1st<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
          ::_M_emplace_unique<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>&>
                    ((_Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>,std::_Select1st<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
                      *)&cmCPluginAPISourceFiles,
                     (pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *)&local_58);
  _Var3 = pVar5.first._M_node;
LAB_001f55c5:
  return _Var3._M_node[1]._M_parent;
}

Assistant:

void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    cmCPluginAPISourceFileMap::iterator i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->GetFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be re-used and deleted later.
      cmCPluginAPISourceFileMap::value_type entry(rsf, sf);
      i = cmCPluginAPISourceFiles.insert(entry).first;
    }
    return i->second;
  }
  return nullptr;
}